

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O0

output_type *
testinator::Arbitrary<std::array<int,_10UL>_>::generate
          (output_type *__return_storage_ptr__,size_t generation,unsigned_long randomSeed)

{
  anon_class_16_2_2856ea55 __gen;
  iterator __first;
  unsigned_long local_18;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  if (generation != 0) {
    local_18 = randomSeed;
    randomSeed_local = generation;
    __first = ::std::array<int,_10UL>::begin(__return_storage_ptr__);
    __gen.randomSeed = &local_18;
    __gen.generation = &randomSeed_local;
    ::std::
    generate_n<int*,unsigned_long,testinator::Arbitrary<std::array<int,10ul>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              (__first,10,__gen);
  }
  return __return_storage_ptr__;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::generate_n(
          v.begin(), N,
          [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }